

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::GetSymbolFromObjectFile
               (int fd,uint64_t pc,char *out,size_t out_size,uint64_t base_address)

{
  bool bVar1;
  undefined1 local_f0 [8];
  Elf64_Shdr strtab;
  Elf64_Shdr symtab;
  Elf64_Ehdr elf_header;
  uint64_t base_address_local;
  size_t out_size_local;
  char *out_local;
  uint64_t pc_local;
  int fd_local;
  
  bVar1 = ReadFromOffsetExact(fd,&symtab.sh_entsize,0x40,0);
  if (!bVar1) {
    return false;
  }
  bVar1 = GetSectionHeaderByType
                    (fd,elf_header.e_ehsize,elf_header.e_phoff,2,(Elf64_Shdr *)&strtab.sh_entsize);
  if (bVar1) {
    bVar1 = ReadFromOffsetExact(fd,local_f0,0x40,
                                elf_header.e_phoff + (ulong)(uint)symtab.sh_size * 0x40);
    if (!bVar1) {
      return false;
    }
    bVar1 = FindSymbol(pc,fd,out,out_size,base_address,(Elf64_Shdr *)local_f0,
                       (Elf64_Shdr *)&strtab.sh_entsize);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = GetSectionHeaderByType
                    (fd,elf_header.e_ehsize,elf_header.e_phoff,0xb,(Elf64_Shdr *)&strtab.sh_entsize)
  ;
  if (bVar1) {
    bVar1 = ReadFromOffsetExact(fd,local_f0,0x40,
                                elf_header.e_phoff + (ulong)(uint)symtab.sh_size * 0x40);
    if (!bVar1) {
      return false;
    }
    bVar1 = FindSymbol(pc,fd,out,out_size,base_address,(Elf64_Shdr *)local_f0,
                       (Elf64_Shdr *)&strtab.sh_entsize);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool GetSymbolFromObjectFile(const int fd, uint64_t pc, char* out,
                                    size_t out_size, uint64_t base_address) {
  // Read the ELF header.
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) symtab, strtab;

  // Consult a regular symbol table first.
  if (GetSectionHeaderByType(fd, elf_header.e_shnum, elf_header.e_shoff,
                             SHT_SYMTAB, &symtab)) {
    if (!ReadFromOffsetExact(
            fd, &strtab, sizeof(strtab),
            elf_header.e_shoff + symtab.sh_link * sizeof(symtab))) {
      return false;
    }
    if (FindSymbol(pc, fd, out, out_size, base_address, &strtab, &symtab)) {
      return true;  // Found the symbol in a regular symbol table.
    }
  }

  // If the symbol is not found, then consult a dynamic symbol table.
  if (GetSectionHeaderByType(fd, elf_header.e_shnum, elf_header.e_shoff,
                             SHT_DYNSYM, &symtab)) {
    if (!ReadFromOffsetExact(
            fd, &strtab, sizeof(strtab),
            elf_header.e_shoff + symtab.sh_link * sizeof(symtab))) {
      return false;
    }
    if (FindSymbol(pc, fd, out, out_size, base_address, &strtab, &symtab)) {
      return true;  // Found the symbol in a dynamic symbol table.
    }
  }

  return false;
}